

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O1

void Unr_ManSetup(Unr_Man_t *p,int fVerbose)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  Vec_Int_t *vRoots;
  int *piVar7;
  Vec_Int_t *vRoots_00;
  undefined4 *__s;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  Gia_Obj_t *pGVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  size_t __nmemb;
  timespec ts;
  timespec local_50;
  ulong local_40;
  size_t local_38;
  
  iVar6 = clock_gettime(3,&local_50);
  if (iVar6 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (p->vOrder->nSize != 0) {
    __assert_fail("Vec_IntSize(p->vOrder) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                  ,0xc2,"void Unr_ManSetup(Unr_Man_t *, int)");
  }
  Vec_IntPush(p->vOrder,0);
  Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
  if (0 < p->vTents->nSize) {
    *p->vTents->pArray = 0;
    if (0 < p->vRanks->nSize) {
      *p->vRanks->pArray = 0;
      vRoots = (Vec_Int_t *)malloc(0x10);
      vRoots->nCap = 100;
      vRoots->nSize = 0;
      piVar7 = (int *)malloc(400);
      vRoots->pArray = piVar7;
      vRoots_00 = (Vec_Int_t *)malloc(0x10);
      vRoots_00->nCap = 100;
      vRoots_00->nSize = 0;
      piVar7 = (int *)malloc(400);
      vRoots_00->pArray = piVar7;
      pGVar9 = p->pGia;
      pVVar10 = pGVar9->vCos;
      uVar12 = (ulong)(uint)pVVar10->nSize;
      if (pGVar9->nRegs < pVVar10->nSize) {
        lVar23 = 0;
        do {
          if ((int)uVar12 <= lVar23) goto LAB_005b593a;
          iVar6 = pVVar10->pArray[lVar23];
          if ((iVar6 < 0) || (pGVar9->nObjs <= iVar6)) goto LAB_005b5959;
          if (pGVar9->pObjs == (Gia_Obj_t *)0x0) break;
          Unr_ManSetup_rec(p,iVar6,0,vRoots);
          lVar23 = lVar23 + 1;
          pGVar9 = p->pGia;
          pVVar10 = pGVar9->vCos;
          uVar12 = (ulong)pVVar10->nSize;
        } while (lVar23 < (long)(uVar12 - (long)pGVar9->nRegs));
      }
      iVar6 = vRoots->nSize;
      while (pVVar10 = vRoots, 0 < iVar6) {
        Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
        vRoots_00->nSize = 0;
        if (0 < pVVar10->nSize) {
          lVar23 = 0;
          do {
            Unr_ManSetup_rec(p,pVVar10->pArray[lVar23],p->vOrderLim->nSize + -1,vRoots_00);
            lVar23 = lVar23 + 1;
          } while (lVar23 < pVVar10->nSize);
        }
        iVar6 = vRoots_00->nSize;
        vRoots = vRoots_00;
        vRoots_00 = pVVar10;
      }
      Vec_IntPush(p->vOrderLim,p->vOrder->nSize);
      if (pVVar10->pArray != (int *)0x0) {
        free(pVVar10->pArray);
        pVVar10->pArray = (int *)0x0;
      }
      if (pVVar10 != (Vec_Int_t *)0x0) {
        free(pVVar10);
      }
      if (vRoots_00->pArray != (int *)0x0) {
        free(vRoots_00->pArray);
        vRoots_00->pArray = (int *)0x0;
      }
      if (vRoots_00 != (Vec_Int_t *)0x0) {
        free(vRoots_00);
      }
      lVar23 = (long)p->vOrder->nSize;
      if (lVar23 < 1) {
        uVar12 = 0;
      }
      else {
        lVar14 = 0;
        uVar12 = 0;
        do {
          iVar6 = p->vOrder->pArray[lVar14];
          if (((long)iVar6 < 0) || (p->vRanks->nSize <= iVar6)) goto LAB_005b593a;
          uVar12 = (ulong)((int)uVar12 + (p->vRanks->pArray[iVar6] + 1U & 0xfffffffe) + 6);
          lVar14 = lVar14 + 1;
        } while (lVar23 != lVar14);
      }
      __nmemb = (size_t)(int)uVar12;
      local_40 = uVar12;
      piVar7 = (int *)calloc(__nmemb,4);
      p->pObjs = piVar7;
      p->pEnd = piVar7 + __nmemb;
      if ((int)uVar12 < 1) {
LAB_005b5978:
        __assert_fail("h >= 0 && h < p->pEnd - p->pObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                      ,0x44,"Unr_Obj_t *Unr_ManObj(Unr_Man_t *, int)");
      }
      if (p->vRanks->nSize < 1) {
LAB_005b593a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      *(ulong *)(piVar7 + 2) =
           (*(ulong *)(piVar7 + 2) & 0xfffe000300000003 |
           (ulong)(*p->vRanks->pArray + 1U & 0x7fff) << 0x22) + 0xfffffffc;
      piVar7[5] = 0;
      uVar1 = p->nObjs;
      uVar20 = 0x10;
      if (0xe < uVar1 - 1) {
        uVar20 = uVar1;
      }
      if (uVar20 == 0) {
        __s = (undefined4 *)0x0;
      }
      else {
        __s = (undefined4 *)malloc((long)(int)uVar20 << 2);
      }
      if (__s != (undefined4 *)0x0) {
        memset(__s,0xff,(long)(int)uVar1 << 2);
      }
      if (0 < (int)uVar1) {
        *__s = 0;
        if (p->vObjLim->nSize != 0) {
          __assert_fail("Vec_IntSize(p->vObjLim) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                        ,0xe8,"void Unr_ManSetup(Unr_Man_t *, int)");
        }
        piVar7 = piVar7 + (ulong)((uint)((ulong)*(undefined8 *)(piVar7 + 2) >> 0x22) & 0x7ffe) + 6;
        iVar6 = p->vOrderLim->nSize;
        local_38 = __nmemb;
        if (1 < iVar6) {
          uVar12 = (ulong)(iVar6 - 2);
          do {
            lVar23 = (long)p->vOrderLim->nSize;
            if ((lVar23 <= (long)uVar12) || (lVar23 <= (long)(uVar12 + 1))) goto LAB_005b593a;
            piVar2 = p->vOrderLim->pArray;
            uVar20 = piVar2[uVar12];
            uVar8 = (ulong)uVar20;
            iVar6 = piVar2[uVar12 + 1];
            Vec_IntPush(p->vObjLim,(int)((ulong)((long)piVar7 - (long)p->pObjs) >> 2));
            uVar21 = uVar20;
            while ((int)uVar21 < iVar6) {
              if (((int)uVar20 < 0) || (p->vOrder->nSize <= (int)uVar8)) goto LAB_005b593a;
              iVar18 = p->vOrder->pArray[uVar8];
              lVar23 = (long)iVar18;
              if ((lVar23 < 0) || (p->pGia->nObjs <= iVar18)) goto LAB_005b5959;
              piVar2 = p->pObjs;
              if ((((long)piVar7 - (long)piVar2 & 0x200000000U) != 0) ||
                 (uVar19 = (ulong)((uint)((ulong)((long)piVar7 - (long)piVar2) >> 2) & 0x7fffffff),
                 (long)p->pEnd - (long)piVar2 >> 2 <= (long)uVar19)) goto LAB_005b5978;
              pGVar15 = p->pGia->pObjs + lVar23;
              uVar16 = *(ulong *)(piVar2 + uVar19 + 2);
              *(ulong *)(piVar2 + uVar19 + 2) = uVar16 | 0xfffffffc;
              uVar21 = (uint)*(undefined8 *)pGVar15;
              if ((~uVar21 & 0x1fffffff) != 0) {
                iVar17 = p->vTents->nSize;
                if (((iVar17 <= iVar18) ||
                    (uVar21 = iVar18 - (uVar21 & 0x1fffffff), (int)uVar21 < 0)) ||
                   (iVar17 <= (int)uVar21)) goto LAB_005b593a;
                piVar3 = p->vTents->pArray;
                uVar21 = ~piVar3[uVar21] + piVar3[lVar23];
                if ((int)uVar21 < 1) {
                  uVar21 = 0;
                }
                *(ulong *)(piVar2 + uVar19 + 2) =
                     ((uVar16 | 0xfffffffc) & 0xfffffffffffe0003) + (ulong)(uVar21 & 0x7fff) * 4;
              }
              uVar4 = *(undefined8 *)pGVar15;
              uVar21 = (uint)uVar4;
              uVar13 = (uint)((ulong)uVar4 >> 0x20);
              if ((~uVar21 & 0x1fffffff) == 0 || (int)uVar21 < 0) {
                if (((uVar21 & 0x9fffffff) == 0x9fffffff) &&
                   (p->pGia->vCis->nSize - p->pGia->nRegs <= (int)(uVar13 & 0x1fffffff))) {
                  uVar16 = *(ulong *)(piVar2 + uVar19 + 2) & 0xfffffffffffe0003;
                  goto LAB_005b52ea;
                }
              }
              else {
                iVar17 = p->vTents->nSize;
                if (((iVar17 <= iVar18) ||
                    (uVar21 = iVar18 - (uVar13 & 0x1fffffff), (int)uVar21 < 0)) ||
                   (iVar17 <= (int)uVar21)) goto LAB_005b593a;
                piVar3 = p->vTents->pArray;
                iVar17 = ~piVar3[uVar21] + piVar3[lVar23];
                if (iVar17 < 1) {
                  iVar17 = 0;
                }
                uVar16 = *(ulong *)(piVar2 + uVar19 + 2) & 0xffffffff0001ffff |
                         (ulong)(uint)(iVar17 << 0x11);
LAB_005b52ea:
                *(ulong *)(piVar2 + uVar19 + 2) = uVar16;
              }
              if (p->vRanks->nSize <= iVar18) goto LAB_005b593a;
              uVar21 = p->vRanks->pArray[lVar23] + 1;
              *(ulong *)(piVar2 + uVar19 + 2) =
                   *(ulong *)(piVar2 + uVar19 + 2) & 0x3ffffffff | (ulong)uVar21 << 0x22 |
                   0xfffe000000000000;
              piVar2[uVar19 + 4] = iVar18;
              if ((uVar21 & 0x7fff) != 0) {
                uVar16 = 0;
                do {
                  piVar2[uVar19 + uVar16 + 5] = -1;
                  uVar16 = uVar16 + 1;
                } while (uVar16 < ((uint)((ulong)*(undefined8 *)(piVar2 + uVar19 + 2) >> 0x22) &
                                  0x7fff));
              }
              uVar16 = (long)piVar7 - (long)p->pObjs;
              if ((uVar16 & 4) != 0) {
                __assert_fail("((pInts - p->pObjs) & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                              ,0xfe,"void Unr_ManSetup(Unr_Man_t *, int)");
              }
              if ((int)uVar1 <= iVar18) goto LAB_005b5997;
              __s[lVar23] = (int)(uVar16 >> 2);
              piVar7 = piVar7 + (ulong)((uint)((ulong)*(undefined8 *)(piVar2 + uVar19 + 2) >> 0x22)
                                       & 0x7ffe) + 6;
              uVar8 = uVar8 + 1;
              uVar21 = (uint)uVar8;
            }
            bVar5 = 0 < (long)uVar12;
            uVar12 = uVar12 - 1;
          } while (bVar5);
        }
        if ((long)piVar7 - (long)p->pObjs >> 2 != local_38) {
          __assert_fail("pInts - p->pObjs == nInts",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcUnroll.c"
                        ,0x103,"void Unr_ManSetup(Unr_Man_t *, int)");
        }
        pGVar9 = p->pGia;
        if (0 < pGVar9->nObjs) {
          lVar23 = 0;
          uVar12 = 0;
          do {
            pGVar15 = pGVar9->pObjs;
            if (pGVar15 == (Gia_Obj_t *)0x0) break;
            if (uVar1 == uVar12) goto LAB_005b593a;
            uVar8 = (ulong)(uint)__s[uVar12];
            if (uVar8 != 0xffffffff) {
              if (((int)__s[uVar12] < 0) ||
                 (piVar7 = p->pObjs, (long)p->pEnd - (long)piVar7 >> 2 <= (long)uVar8))
              goto LAB_005b5978;
              uVar20 = (uint)*(undefined8 *)(&pGVar15->field_0x0 + lVar23);
              if ((~uVar20 & 0x1fffffff) != 0) {
                uVar20 = (int)uVar12 - (uVar20 & 0x1fffffff);
                if (uVar1 <= uVar20) goto LAB_005b593a;
                piVar7[uVar8] = __s[uVar20];
                uVar16 = (ulong)(*(uint *)(&pGVar15->field_0x0 + lVar23) >> 0x1d & 1);
                uVar19 = *(ulong *)(piVar7 + uVar8 + 2);
                *(ulong *)(piVar7 + uVar8 + 2) = uVar19 & 0xfffffffffffffffe | uVar16;
                uVar20 = (uint)*(undefined8 *)(&pGVar15->field_0x0 + lVar23);
                if ((~uVar20 & 0x1fffffff) == 0 || -1 < (int)uVar20) {
                  uVar22 = 0;
                }
                else {
                  uVar22 = 0;
                  if ((int)((uint)((ulong)*(undefined8 *)(&pGVar15->field_0x0 + lVar23) >> 0x20) &
                           0x1fffffff) < p->pGia->vCos->nSize - p->pGia->nRegs) {
                    uVar22 = 0x200000000;
                  }
                }
                *(ulong *)(piVar7 + uVar8 + 2) = uVar19 & 0xfffffffdfffffffe | uVar16 | uVar22;
              }
              uVar20 = (uint)*(undefined8 *)(&pGVar15->field_0x0 + lVar23);
              uVar21 = (uint)((ulong)*(undefined8 *)(&pGVar15->field_0x0 + lVar23) >> 0x20);
              if ((~uVar20 & 0x1fffffff) == 0 || (int)uVar20 < 0) {
                if ((uVar20 & 0x9fffffff) == 0x9fffffff) {
                  pGVar9 = p->pGia;
                  if ((int)(uVar21 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs) {
                    if ((int)(uVar21 & 0x1fffffff) < pGVar9->vCis->nSize - pGVar9->nRegs) {
                      if (-1 < (int)uVar20) {
                        __assert_fail("pObj->fTerm",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                      ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
                      }
                      piVar7[uVar8] = uVar21 & 0x1fffffff;
                      if ((long)p->vTents->nSize <= (long)uVar12) goto LAB_005b593a;
                      piVar7[uVar8 + 1] = p->vTents->pArray[uVar12];
                      *(ulong *)(piVar7 + uVar8 + 2) = *(ulong *)(piVar7 + uVar8 + 2) | 0x100000000;
                    }
                  }
                  else {
                    iVar6 = pGVar9->vCis->nSize;
                    if ((int)(uVar21 & 0x1fffffff) < iVar6 - pGVar9->nRegs) {
                      __assert_fail("Gia_ObjIsRo(p, pObj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                                    ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                    }
                    iVar18 = pGVar9->vCos->nSize;
                    uVar20 = (iVar18 - iVar6) + (uVar21 & 0x1fffffff);
                    if (((int)uVar20 < 0) || (iVar18 <= (int)uVar20)) goto LAB_005b593a;
                    iVar6 = pGVar9->vCos->pArray[uVar20];
                    if (((long)iVar6 < 0) || (pGVar9->nObjs <= iVar6)) goto LAB_005b5959;
                    if ((int)uVar1 <= iVar6) goto LAB_005b593a;
                    piVar7[uVar8] = __s[iVar6];
                    *(byte *)(piVar7 + uVar8 + 2) = *(byte *)(piVar7 + uVar8 + 2) & 0xfe;
                  }
                }
              }
              else {
                uVar20 = (int)uVar12 - (uVar21 & 0x1fffffff);
                if (uVar1 <= uVar20) goto LAB_005b593a;
                piVar7[uVar8 + 1] = __s[uVar20];
                *(ulong *)(piVar7 + uVar8 + 2) =
                     *(ulong *)(piVar7 + uVar8 + 2) & 0xfffffffffffffffd |
                     (ulong)((uint)((ulong)*(undefined8 *)(&pGVar15->field_0x0 + lVar23) >> 0x3c) &
                            2);
              }
            }
            uVar12 = uVar12 + 1;
            pGVar9 = p->pGia;
            lVar23 = lVar23 + 0xc;
          } while ((long)uVar12 < (long)pGVar9->nObjs);
        }
        pGVar9 = p->pGia;
        pVVar10 = pGVar9->vCis;
        if (0 < pVVar10->nSize) {
          lVar23 = 0;
          do {
            iVar6 = pVVar10->pArray[lVar23];
            if (((long)iVar6 < 0) || (pGVar9->nObjs <= iVar6)) goto LAB_005b5959;
            if (pGVar9->pObjs == (Gia_Obj_t *)0x0) break;
            if ((int)uVar1 <= iVar6) goto LAB_005b593a;
            Vec_IntPush(p->vCiMap,__s[iVar6]);
            lVar23 = lVar23 + 1;
            pGVar9 = p->pGia;
            pVVar10 = pGVar9->vCis;
          } while (lVar23 < pVVar10->nSize);
        }
        pGVar9 = p->pGia;
        pVVar10 = pGVar9->vCos;
        if (0 < pVVar10->nSize) {
          lVar23 = 0;
          do {
            iVar6 = pVVar10->pArray[lVar23];
            if (((long)iVar6 < 0) || (pGVar9->nObjs <= iVar6)) {
LAB_005b5959:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if (pGVar9->pObjs == (Gia_Obj_t *)0x0) break;
            if ((int)uVar1 <= iVar6) goto LAB_005b593a;
            Vec_IntPush(p->vCoMap,__s[iVar6]);
            lVar23 = lVar23 + 1;
            pGVar9 = p->pGia;
            pVVar10 = pGVar9->vCos;
          } while (lVar23 < pVVar10->nSize);
        }
        free(__s);
        if (fVerbose != 0) {
          Unr_ManProfileRanks(p->vRanks);
          printf("Memory usage = %6.2f MB  ",(double)(int)local_40 * 4.0 * 9.5367431640625e-07);
          iVar18 = 3;
          iVar6 = clock_gettime(3,&local_50);
          if (iVar6 < 0) {
            lVar23 = -1;
          }
          else {
            lVar23 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          Abc_Print(iVar18,"%s =","Time");
          Abc_Print(iVar18,"%9.2f sec\n",(double)(lVar23 + lVar11) / 1000000.0);
        }
        if (p->vOrder != (Vec_Int_t *)0x0) {
          piVar7 = p->vOrder->pArray;
          if (piVar7 != (int *)0x0) {
            free(piVar7);
            p->vOrder->pArray = (int *)0x0;
          }
          if (p->vOrder != (Vec_Int_t *)0x0) {
            free(p->vOrder);
            p->vOrder = (Vec_Int_t *)0x0;
          }
        }
        if (p->vOrderLim != (Vec_Int_t *)0x0) {
          piVar7 = p->vOrderLim->pArray;
          if (piVar7 != (int *)0x0) {
            free(piVar7);
            p->vOrderLim->pArray = (int *)0x0;
          }
          if (p->vOrderLim != (Vec_Int_t *)0x0) {
            free(p->vOrderLim);
            p->vOrderLim = (Vec_Int_t *)0x0;
          }
        }
        if (p->vRanks != (Vec_Int_t *)0x0) {
          piVar7 = p->vRanks->pArray;
          if (piVar7 != (int *)0x0) {
            free(piVar7);
            p->vRanks->pArray = (int *)0x0;
          }
          if (p->vRanks != (Vec_Int_t *)0x0) {
            free(p->vRanks);
            p->vRanks = (Vec_Int_t *)0x0;
          }
        }
        if (p->vTents != (Vec_Int_t *)0x0) {
          piVar7 = p->vTents->pArray;
          if (piVar7 != (int *)0x0) {
            free(piVar7);
            p->vTents->pArray = (int *)0x0;
          }
          if (p->vTents != (Vec_Int_t *)0x0) {
            free(p->vTents);
            p->vTents = (Vec_Int_t *)0x0;
          }
        }
        return;
      }
    }
  }
LAB_005b5997:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Unr_ManSetup( Unr_Man_t * p, int fVerbose )
{
    Vec_Int_t * vRoots, * vRoots2, * vMap;
    Unr_Obj_t * pUnrObj;
    Gia_Obj_t * pObj;
    int i, k, t, iObj, nInts, * pInts;
    abctime clk = Abc_Clock();
    // create zero rank
    assert( Vec_IntSize(p->vOrder) == 0 );
    Vec_IntPush( p->vOrder, 0 );
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntWriteEntry( p->vTents, 0, 0 );
    Vec_IntWriteEntry( p->vRanks, 0, 0 );
    // start from the POs
    vRoots  = Vec_IntAlloc( 100 );
    vRoots2 = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p->pGia, pObj, i )
        Unr_ManSetup_rec( p, Gia_ObjId(p->pGia, pObj), 0, vRoots );
    // collect tents
    while ( Vec_IntSize(vRoots) > 0 )
    {
        Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
        Vec_IntClear( vRoots2 );
        Vec_IntForEachEntry( vRoots, iObj, i )
            Unr_ManSetup_rec( p, iObj, Vec_IntSize(p->vOrderLim)-1, vRoots2 );
        ABC_SWAP( Vec_Int_t *, vRoots, vRoots2 );
    }
    Vec_IntPush( p->vOrderLim, Vec_IntSize(p->vOrder) );
    Vec_IntFree( vRoots );
    Vec_IntFree( vRoots2 );
    // allocate memory
    nInts = 0;
    Vec_IntForEachEntry( p->vOrder, iObj, i )
        nInts += Unr_ObjSizeInt( Vec_IntEntry(p->vRanks, iObj) + 1 );
    p->pObjs = pInts = ABC_CALLOC( int, nInts );
    p->pEnd = p->pObjs + nInts;
    // create const0 node
    pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
    pUnrObj->RankMax = Vec_IntEntry(p->vRanks, 0) + 1;
    pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
    pUnrObj->Res[0]  = 0; // const0
    // map the objects
    vMap = Vec_IntStartFull( p->nObjs );
    Vec_IntWriteEntry( vMap, 0, pInts - p->pObjs );
    pInts += Unr_ObjSize(pUnrObj);
    // mark up the entries
    assert( Vec_IntSize(p->vObjLim) == 0 );
    for ( t = Vec_IntSize(p->vOrderLim) - 2; t >= 0; t-- )
    {
        int Beg = Vec_IntEntry(p->vOrderLim, t);
        int End = Vec_IntEntry(p->vOrderLim, t+1);
        Vec_IntPush( p->vObjLim, pInts - p->pObjs );
        Vec_IntForEachEntryStartStop( p->vOrder, iObj, i, Beg, End )
        {
            pObj = Gia_ManObj( p->pGia, iObj );
            pUnrObj = Unr_ManObj( p, pInts - p->pObjs );
            pUnrObj->uRDiff0 = pUnrObj->uRDiff1 = UNR_DIFF_NULL;
            if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
                pUnrObj->uRDiff0 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId0(pObj, iObj)) - 1);
            if ( Gia_ObjIsAnd(pObj) )
                pUnrObj->uRDiff1 = Abc_MaxInt(0, Vec_IntEntry(p->vTents, iObj) - Vec_IntEntry(p->vTents, Gia_ObjFaninId1(pObj, iObj)) - 1);
            else if ( Gia_ObjIsRo(p->pGia, pObj) )
                pUnrObj->uRDiff0 = 0;
            pUnrObj->RankMax = Vec_IntEntry(p->vRanks, iObj) + 1;
            pUnrObj->RankCur = UNR_DIFF_NULL;
            pUnrObj->OrigId  = iObj;
            for ( k = 0; k < (int)pUnrObj->RankMax; k++ )
                pUnrObj->Res[k] = -1;
            assert( ((pInts - p->pObjs) & 1) == 0 ); // align for 64-bits
            Vec_IntWriteEntry( vMap, iObj, pInts - p->pObjs );
            pInts += Unr_ObjSize( pUnrObj );
        }
    }
    assert( pInts - p->pObjs == nInts );
    // label the objects
    Gia_ManForEachObj( p->pGia, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            continue;
        pUnrObj = Unr_ManObj( p, Vec_IntEntry(vMap, i) );
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjFaninId0(pObj, i) );
            pUnrObj->fCompl0 = Gia_ObjFaninC0(pObj);
            pUnrObj->fItIsPo = Gia_ObjIsPo(p->pGia, pObj);
        }
        if ( Gia_ObjIsAnd(pObj) )
        {
            pUnrObj->hFan1   = Vec_IntEntry( vMap, Gia_ObjFaninId1(pObj, i) );
            pUnrObj->fCompl1 = Gia_ObjFaninC1(pObj);
        }
        else if ( Gia_ObjIsRo(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Vec_IntEntry( vMap, Gia_ObjId(p->pGia, Gia_ObjRoToRi(p->pGia, pObj)) );
            pUnrObj->fCompl0 = 0;
        }
        else if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            pUnrObj->hFan0   = Gia_ObjCioId(pObj);           // remember CIO id
            pUnrObj->hFan1   = Vec_IntEntry(p->vTents, i);   // remember tent
            pUnrObj->fItIsPi = 1;
        }
    }
    // store CI/PO objects;
    Gia_ManForEachCi( p->pGia, pObj, i )
        Vec_IntPush( p->vCiMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Gia_ManForEachCo( p->pGia, pObj, i )
        Vec_IntPush( p->vCoMap, Vec_IntEntry(vMap, Gia_ObjId(p->pGia, pObj)) );
    Vec_IntFreeP( &vMap );
    // print stats
    if ( fVerbose )
    {
        Unr_ManProfileRanks( p->vRanks );
        printf( "Memory usage = %6.2f MB  ", 4.0 * nInts / (1<<20) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vOrderLim );
    Vec_IntFreeP( &p->vRanks );
    Vec_IntFreeP( &p->vTents );
}